

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_EnergyReport_Test::TestBody(InterpreterTestSuite_PC_EnergyReport_Test *this)

{
  EnergyReport *pEVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  TypedExpectation<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
  *this_00;
  ActionInterface<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *impl;
  char *in_R9;
  Expression expr;
  AssertionResult gtest_ar_;
  Value value;
  EnergyReport rep;
  TestContext ctx;
  Expression local_278;
  Matcher<const_ot::commissioner::Address_&> local_258;
  AssertHelper local_238;
  Expression local_230;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f0;
  char local_1e0 [16];
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  element_type *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  EnergyReport local_188;
  TestContext local_158;
  
  InterpreterTestSuite::TestContext::TestContext(&local_158);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_158);
  local_188.mEnergyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mEnergyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.mChannelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.mEnergyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mChannelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mChannelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a9bc8;
  local_258.super_MatcherBase<const_ot::commissioner::Address_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a2e10;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<ot::commissioner::Address_const&>const*>
            (&local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_258.super_MatcherBase<const_ot::commissioner::Address_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a2dc8;
  CommissionerAppMock::gmock_GetEnergyReport
            ((MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *)
             local_1d0,
             local_158.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_258);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
            InternalExpectedAt((MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                                *)local_1d0,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0x86a,"*ctx.mDefaultCommissionerObject","GetEnergyReport(_)");
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  ((local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)&local_188;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ot::commissioner::EnergyReport**>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
             (EnergyReport **)
             local_278.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  impl = (ActionInterface<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
          *)operator_new(0x18);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_003a9e58;
  pEVar1 = (EnergyReport *)
           ((local_278.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  impl[1]._vptr_ActionInterface = (_func_int **)pEVar1;
  impl[2]._vptr_ActionInterface = (_func_int **)pEVar1;
  testing::Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::Action
            ((Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *)
             local_218,impl);
  testing::internal::
  TypedExpectation<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
  WillOnce(this_00,(Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                    *)local_218);
  if ((_Manager_type)local_208._M_allocated_capacity != (_Manager_type)0x0) {
    (*(code *)local_208._M_allocated_capacity)(local_218,local_218,3);
  }
  if (local_278.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_1c8._M_p = (pointer)&PTR__MatcherBase_003a2e10;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]));
  }
  local_258.super_MatcherBase<const_ot::commissioner::Address_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a2e10;
  if (local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0._0_4_ = kNone;
  local_1c0 = (element_type *)0x0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_218._0_8_ = &local_208;
  local_1c8._M_p = (pointer)&local_1b8;
  local_1a8._M_p = (pointer)&local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"energy report 1234::5678","")
  ;
  ot::commissioner::Interpreter::ParseExpression
            (&local_230,&local_158.mInterpreter,(string *)local_218);
  local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            local_278.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_258.super_MatcherBase<const_ot::commissioner::Address_&>._vptr_MatcherBase =
       (_func_int **)
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_230.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_230.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_230.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_230.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._0_8_ != &local_208) {
    operator_delete((void *)local_218._0_8_);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_218,&local_158.mInterpreter,&local_278);
  local_1d0._0_4_ = local_218._0_4_;
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)(local_218 + 8));
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1f0);
  if (local_1f0._M_p != local_1e0) {
    operator_delete(local_1f0._M_p);
  }
  if ((char *)local_218._8_8_ != local_208._M_local_buf + 8) {
    operator_delete((void *)local_218._8_8_);
  }
  bVar4 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_1d0);
  local_258.super_MatcherBase<const_ot::commissioner::Address_&>._vptr_MatcherBase =
       (_func_int **)
       CONCAT71(local_258.super_MatcherBase<const_ot::commissioner::Address_&>._vptr_MatcherBase.
                _1_7_,bVar4);
  local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_218,(internal *)&local_258,(AssertionResult *)0x2e6ffe,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x871,(char *)local_218._0_8_);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._0_8_ != &local_208) {
      operator_delete((void *)local_218._0_8_);
    }
    if (local_230.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((local_230.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
    }
  }
  peVar3 = local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    peVar2 = (element_type *)
             ((local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    if (peVar2 != local_258.super_MatcherBase<const_ot::commissioner::Address_&>.impl_.
                  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Address_&>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + 2) {
      operator_delete(peVar2);
    }
    operator_delete(peVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  if (local_188.mEnergyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mEnergyList.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_188.mChannelMask);
  InterpreterTestSuite::TestContext::~TestContext(&local_158);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_EnergyReport)
{
    TestContext ctx;
    InitContext(ctx);

    EnergyReport rep;
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetEnergyReport(_)).WillOnce(Return(&rep));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("energy report 1234::5678");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}